

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O0

IntrinsicResult intrinsic_import(Context *context,IntrinsicResult *partialResult)

{
  Context *this;
  Machine *this_00;
  bool bVar1;
  bool bVar2;
  uchar uVar3;
  String *other;
  size_t sVar4;
  char *__filename;
  FunctionStorage *func;
  anon_union_8_3_2f476f46_for_data *msg;
  bool *msg_00;
  Value local_320;
  Value local_310;
  FunctionStorage *local_300;
  FunctionStorage *import;
  String local_2e8;
  undefined1 local_2d8 [8];
  Parser parser;
  RuntimeException local_238;
  undefined1 local_208 [32];
  FILE *handle;
  String local_1d8;
  String local_1c8;
  String local_1b8;
  undefined1 local_1a8 [8];
  String path;
  long len;
  long i;
  undefined1 local_180 [7];
  bool found;
  String moduleSource;
  Value local_160;
  List<MiniScript::String> local_150;
  undefined1 local_140 [8];
  StringList libDirs;
  undefined1 local_118 [8];
  Value searchPath;
  RuntimeException local_f8;
  String local_c8;
  undefined1 local_b8 [24];
  String libname;
  String local_88;
  Context *local_78;
  Context *callerContext;
  undefined1 local_60 [24];
  String libname_1;
  Value importedValues;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  MiniScript::IntrinsicResult::Result((IntrinsicResult *)&importedValues.data);
  bVar1 = MiniScript::Value::IsNull((Value *)&importedValues.data);
  MiniScript::Value::~Value((Value *)&importedValues.data);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    MiniScript::String::String(&local_c8,"libname");
    MiniScript::Context::GetVar
              ((Context *)local_b8,(String *)partialResult,(LocalOnlyMode)&local_c8);
    MiniScript::Value::ToString((Value *)(local_b8 + 0x10),(Machine *)local_b8);
    MiniScript::Value::~Value((Value *)local_b8);
    MiniScript::String::~String(&local_c8);
    bVar1 = MiniScript::String::empty((String *)(local_b8 + 0x10));
    if (bVar1) {
      MiniScript::String::String((String *)&searchPath.data,"import: libname required");
      msg = &searchPath.data;
      MiniScript::RuntimeException::RuntimeException(&local_f8,(String *)msg);
      MiniScript::RuntimeException::raise(&local_f8,(int)msg);
      MiniScript::RuntimeException::~RuntimeException(&local_f8);
      MiniScript::String::~String((String *)&searchPath.data);
    }
    getEnvMap();
    MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::Lookup
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)local_118
               ,(Value *)&libDirs.isTemp,&_MS_IMPORT_PATH);
    MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::
    ~Dictionary((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
                &libDirs.isTemp);
    MiniScript::List<MiniScript::String>::List((List<MiniScript::String> *)local_140,0);
    bVar1 = MiniScript::Value::IsNull((Value *)local_118);
    if (!bVar1) {
      MiniScript::Value::ToString(&local_160,(Machine *)local_118);
      MiniScript::String::String((String *)&moduleSource.isTemp,":");
      MiniScript::Split((MiniScript *)&local_150,(String *)&local_160,(String *)&moduleSource.isTemp
                        ,-1);
      MiniScript::List<MiniScript::String>::operator=
                ((List<MiniScript::String> *)local_140,&local_150);
      MiniScript::List<MiniScript::String>::~List(&local_150);
      MiniScript::String::~String((String *)&moduleSource.isTemp);
      MiniScript::String::~String((String *)&local_160);
    }
    MiniScript::String::String((String *)local_180);
    bVar1 = false;
    len = 0;
    path._8_8_ = MiniScript::List<MiniScript::String>::Count((List<MiniScript::String> *)local_140);
    for (; len < (long)path._8_8_; len = len + 1) {
      other = MiniScript::List<MiniScript::String>::operator[]
                        ((List<MiniScript::String> *)local_140,len);
      MiniScript::String::String((String *)local_1a8,other);
      bVar2 = MiniScript::String::empty((String *)local_1a8);
      if (bVar2) {
        MiniScript::String::operator=((String *)local_1a8,".");
      }
      else {
        sVar4 = MiniScript::String::LengthB((String *)local_1a8);
        uVar3 = MiniScript::String::operator[]((String *)local_1a8,sVar4 - 1);
        if (uVar3 != '/') {
          MiniScript::String::String(&local_1b8,'/');
          MiniScript::String::operator+=((String *)local_1a8,&local_1b8);
          MiniScript::String::~String(&local_1b8);
        }
      }
      MiniScript::String::operator+(&local_1c8,local_b8 + 0x10);
      MiniScript::String::operator+=((String *)local_1a8,&local_1c8);
      MiniScript::String::~String(&local_1c8);
      MiniScript::String::String((String *)&handle,(String *)local_1a8);
      ExpandVariables(&local_1d8);
      MiniScript::String::operator=((String *)local_1a8,&local_1d8);
      MiniScript::String::~String(&local_1d8);
      MiniScript::String::~String((String *)&handle);
      __filename = MiniScript::String::c_str((String *)local_1a8);
      local_208._24_8_ = fopen(__filename,"r");
      if ((FILE *)local_208._24_8_ == (FILE *)0x0) {
        local_208._20_4_ = 4;
      }
      else {
        ReadFileHelper((FILE *)local_208,local_208._24_8_);
        MiniScript::String::operator=((String *)local_180,(String *)local_208);
        MiniScript::String::~String((String *)local_208);
        fclose((FILE *)local_208._24_8_);
        bVar1 = true;
        local_208._20_4_ = 2;
      }
      MiniScript::String::~String((String *)local_1a8);
      if (local_208._20_4_ == 2) break;
    }
    if (!bVar1) {
      MiniScript::operator+
                ((MiniScript *)&parser.pending,"import: library not found: ",
                 (String *)(local_b8 + 0x10));
      msg_00 = &parser.pending;
      MiniScript::RuntimeException::RuntimeException(&local_238,(String *)msg_00);
      MiniScript::RuntimeException::raise(&local_238,(int)msg_00);
      MiniScript::RuntimeException::~RuntimeException(&local_238);
      MiniScript::String::~String((String *)&parser.pending);
    }
    MiniScript::Parser::Parser((Parser *)local_2d8);
    MiniScript::String::operator+(&local_2e8,local_b8 + 0x10);
    MiniScript::String::operator=((String *)local_2d8,&local_2e8);
    MiniScript::String::~String(&local_2e8);
    MiniScript::String::String((String *)&import,(String *)local_180);
    MiniScript::Parser::Parse((Parser *)local_2d8,(String *)&import,false);
    MiniScript::String::~String((String *)&import);
    func = MiniScript::Parser::CreateImport((Parser *)local_2d8);
    this_00 = (Machine *)partialResult[0xe].rs;
    local_300 = func;
    MiniScript::Value::Temp(&local_310,0);
    MiniScript::Machine::ManuallyPushCall(this_00,func,&local_310);
    MiniScript::Value::~Value(&local_310);
    MiniScript::Value::Value(&local_320,(String *)(local_b8 + 0x10));
    MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_320,false);
    MiniScript::Value::~Value(&local_320);
    local_208._20_4_ = 1;
    MiniScript::Parser::~Parser((Parser *)local_2d8);
    MiniScript::String::~String((String *)local_180);
    MiniScript::List<MiniScript::String>::~List((List<MiniScript::String> *)local_140);
    MiniScript::Value::~Value((Value *)local_118);
    MiniScript::String::~String((String *)(local_b8 + 0x10));
  }
  else {
    MiniScript::Context::GetTemp((Context *)&libname_1.isTemp,(int)partialResult);
    MiniScript::IntrinsicResult::Result((IntrinsicResult *)local_60);
    MiniScript::Value::ToString((Value *)(local_60 + 0x10),(Machine *)local_60);
    MiniScript::Value::~Value((Value *)local_60);
    this = (Context *)partialResult[0xb].rs;
    local_78 = this;
    MiniScript::String::String(&local_88,(String *)(local_60 + 0x10));
    MiniScript::Value::Value((Value *)&libname.isTemp,(Value *)&libname_1.isTemp);
    MiniScript::Context::SetVar(this,&local_88,(Value *)&libname.isTemp);
    MiniScript::Value::~Value((Value *)&libname.isTemp);
    MiniScript::String::~String(&local_88);
    MiniScript::IntrinsicResult::IntrinsicResult
              ((IntrinsicResult *)context,(IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
    MiniScript::String::~String((String *)(local_60 + 0x10));
    MiniScript::Value::~Value((Value *)&libname_1.isTemp);
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_import(Context *context, IntrinsicResult partialResult) {
	if (!partialResult.Result().IsNull()) {
		// When we're invoked with a partial result, it means that the import
		// function has finished, and stored its result (the values that were
		// created by the import code) in Temp 0.
		Value importedValues = context->GetTemp(0);
		// Now we're going to do something slightly evil.  We're going to reach
		// up into the *parent* context, and store these imported values under
		// the import library name.  Thus, there will always be a standard name
		// by which you can refer to the imported stuff.
		String libname = partialResult.Result().ToString();
		Context *callerContext = context->parent;
		callerContext->SetVar(libname, importedValues);
		return IntrinsicResult::Null;
	}
	// When we're invoked without a partial result, it's time to start the import.
	// Begin by finding the actual code.
	String libname = context->GetVar("libname").ToString();
	if (libname.empty()) {
		RuntimeException("import: libname required").raise();
	}
	
	// Figure out what directories to look for the import modules in.
	Value searchPath = getEnvMap().Lookup(_MS_IMPORT_PATH, Value::null);
	StringList libDirs;
	if (!searchPath.IsNull()) libDirs = Split(searchPath.ToString(), ":");
	
	// Search the lib dirs for a matching file.
	String moduleSource;
	bool found = false;
	for (long i=0, len=libDirs.Count(); i<len; i++) {
		String path = libDirs[i];
		if (path.empty()) path = ".";
		else if (path[path.LengthB() - 1] != PATHSEP) path += String(PATHSEP);
		path += libname + ".ms";
		path = ExpandVariables(path);
		FILE *handle = fopen(path.c_str(), "r");
		if (handle == nullptr) continue;
		moduleSource = ReadFileHelper(handle, -1);
		fclose(handle);
		found = true;
		break;
	}
	if (!found) {
		RuntimeException("import: library not found: " + libname).raise();
	}
	
	// Now, parse that code, and build a function around it that returns
	// its own locals as its result.  Push a manual call.
	Parser parser;
	parser.errorContext = libname + ".ms";
	parser.Parse(moduleSource);
	FunctionStorage *import = parser.CreateImport();
	context->vm->ManuallyPushCall(import, Value::Temp(0));
	
	// That call will not be able to run until we return from this intrinsic.
	// So, return a partial result, with the lib name.  We'll get invoked
	// again after the import function has finished running.
	return IntrinsicResult(libname, false);
}